

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

Mat * RandomMat(Mat *__return_storage_ptr__,int w,int h,int c)

{
  uint64_t uVar1;
  prng_rand_t *state;
  size_t i;
  ulong uVar2;
  
  state = (prng_rand_t *)__return_storage_ptr__;
  ncnn::Mat::Mat(__return_storage_ptr__,w,h,c,4,(Allocator *)0x0);
  for (uVar2 = 0; uVar2 < (long)__return_storage_ptr__->c * __return_storage_ptr__->cstep;
      uVar2 = uVar2 + 1) {
    uVar1 = prng_rand(state);
    *(float *)((long)__return_storage_ptr__->data + uVar2 * 4) =
         (float)uVar1 * 5.421011e-20 * 4.0 + -2.0;
  }
  return __return_storage_ptr__;
}

Assistant:

static ncnn::Mat RandomMat(int w, int h, int c)
{
    ncnn::Mat m(w, h, c);
    Randomize(m);
    return m;
}